

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O3

GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
 BCL::
 local_malloc<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>
           (size_t size)

{
  ulong uVar1;
  ulong *puVar2;
  int iVar3;
  ulong *puVar4;
  ulong *puVar5;
  size_t sVar6;
  ulong uVar7;
  ulong *puVar8;
  size_t sVar9;
  ulong uVar10;
  GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  GVar11;
  
  if (bcl_finalized == '\0') {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)malloc_mutex);
    puVar8 = smem_heap;
    puVar4 = flist;
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    uVar10 = size * 0x20 + 0x3f & 0xffffffffffffffc0;
    for (puVar2 = flist; puVar2 != (ulong *)0x0; puVar2 = (ulong *)puVar2[2]) {
      uVar1 = *puVar2;
      if (uVar10 <= uVar1) {
        puVar8 = puVar2;
        if (uVar10 + 0x80 < uVar1) {
          puVar5 = (ulong *)((long)puVar2 + uVar10 + 0x40);
          *puVar5 = (uVar1 - uVar10) - 0x40;
          uVar1 = puVar2[1];
          *(ulong *)((long)puVar2 + uVar10 + 0x48) = uVar1;
          uVar7 = puVar2[2];
          *(ulong *)((long)puVar2 + uVar10 + 0x50) = uVar7;
          if (uVar1 != 0) {
            *(ulong **)(uVar1 + 0x10) = puVar5;
            uVar7 = puVar2[2];
          }
          if (uVar7 != 0) {
            *(ulong **)(uVar7 + 8) = puVar5;
          }
          *puVar2 = uVar10;
          puVar2[1] = 0;
          puVar2[2] = 0;
          puVar4 = smem_heap;
          if (puVar2 == flist) {
            flist = puVar5;
          }
        }
        else {
          uVar10 = puVar2[1];
          puVar5 = (ulong *)puVar2[2];
          if (uVar10 != 0) {
            *(ulong **)(uVar10 + 0x10) = puVar5;
          }
          if (puVar5 != (ulong *)0x0) {
            puVar5[1] = uVar10;
          }
          if (puVar2 == puVar4) {
            flist = puVar5;
          }
          puVar2[1] = 0;
          puVar2[2] = 0;
          puVar4 = smem_heap;
        }
        goto LAB_001054b7;
      }
    }
    *smem_heap = uVar10;
    puVar4 = (ulong *)((long)puVar8 + uVar10 + 0x40);
    puVar8[1] = 0;
    puVar8[2] = 0;
    if (puVar4 <= (ulong *)(smem_base_ptr + shared_segment_size)) {
LAB_001054b7:
      smem_heap = puVar4;
      pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
      sVar9 = (long)puVar8 + (0x40 - smem_base_ptr);
      sVar6 = my_rank;
      goto LAB_001054d1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)malloc_mutex);
  }
  sVar9 = 0;
  sVar6 = 0;
LAB_001054d1:
  GVar11.ptr = sVar9;
  GVar11.rank = sVar6;
  return GVar11;
}

Assistant:

inline GlobalPtr <T> local_malloc(size_t size) {
  if (bcl_finalized) {
    return nullptr;
  }
  BCL::malloc_mutex.lock();
  size = size * sizeof(T);
  // Align size
  size = ((size + SMALLEST_MEM_UNIT - 1) / SMALLEST_MEM_UNIT) * SMALLEST_MEM_UNIT;

  chunk_t *chunk = flist;

  while (chunk != NULL) {
    if (chunk->size >= size) {
      break;
    }
    chunk = chunk->next;
  }

  char *allocd = nullptr;
  if (chunk != NULL && chunk->size >= size) {
    // I have a chunk!
    if (chunk->size > SMALLEST_MEM_UNIT + size + chunk_t_size()) {
      // Chunk is too big; carve off my piece and
      // replace it with free_chunk in the flist.
      chunk_t *free_chunk = (chunk_t *) (((char *) chunk) + chunk_t_size() + size);
      free_chunk->size = chunk->size - size - chunk_t_size();
      free_chunk->last = chunk->last;
      free_chunk->next = chunk->next;
      if (chunk->last != NULL) {
        chunk->last->next = free_chunk;
      }
      if (chunk->next != NULL) {
        chunk->next->last = free_chunk;
      }
      chunk->size = size;
      chunk->next = NULL;
      chunk->last = NULL;
      if (chunk == flist) {
        flist = free_chunk;
      }
    } else {
      // Chunk is just the right size; carve it
      // off and close the hole in the flist.
      if (chunk->last != NULL) {
        chunk->last->next = chunk->next;
      }
      if (chunk->next != NULL) {
        chunk->next->last = chunk->last;
      }
      if (chunk == flist) {
        flist = chunk->next;
      }
      chunk->last = NULL;
      chunk->next = NULL;
    }
    allocd = ((char *) chunk) + chunk_t_size();
  } else {
    // No free chunk, carve one off the heap.
    chunk = BCL::smem_heap;
    chunk->size = size;
    chunk->next = NULL;
    chunk->last = NULL;
    allocd = ((char *) chunk) + chunk_t_size();
    if (allocd + size > ((char *) BCL::smem_base_ptr) + shared_segment_size) {
      BCL::malloc_mutex.unlock();
      return nullptr;
    } else {
      BCL::smem_heap = (chunk_t *) (((char *) allocd) + size);
    }
  }

  BCL::malloc_mutex.unlock();

  return GlobalPtr <T> (BCL::rank(), (uint64_t) (allocd - (char *) BCL::smem_base_ptr));
}